

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall Jupiter::IRC::Client::Channel::User::~User(User *this)

{
  bool bVar1;
  element_type *peVar2;
  User *this_local;
  
  bVar1 = std::operator==(&this->m_user,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar2 = std::
             __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar2->m_channel_count = peVar2->m_channel_count - 1;
  }
  std::__cxx11::string::~string((string *)&this->m_prefixes);
  std::shared_ptr<Jupiter::IRC::Client::User>::~shared_ptr(&this->m_user);
  return;
}

Assistant:

Jupiter::IRC::Client::Channel::User::~User() {
	if (m_user != nullptr)
		--m_user->m_channel_count;
}